

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra>::Read
          (TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra> *this)

{
  void *in_RDX;
  TPZStream *in_RSI;
  
  Read((TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra> *)
       ((long)(this->super_TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>).fGeo.
              super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
       *(long *)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>).super_TPZGeoEl +
                -0x48) + -0x48),in_RSI,in_RDX);
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::Read(TPZStream &str, void *context) {
    TPZGeoElRefLess<TGeo>::Read(str, context);
    str.Read(this->fSubEl);
    int refpatternindex;
    str.Read(&refpatternindex, 1);
    if (refpatternindex != -1) {
        const std::list< TPZAutoPointer<TPZRefPattern> > &RefPatternList = gRefDBase.RefPatternList(this->Type());
        std::list< TPZAutoPointer<TPZRefPattern> >::const_iterator it;

        for (it = RefPatternList.begin(); it != RefPatternList.end(); it++) {
            if ((*it)->Id() == refpatternindex) {
                break;
            }
        }

        if (it != RefPatternList.end()) {
            fRefPattern = *it;
        } else {
            DebugStop();
        }
    }
}